

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_uqadd_s8_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  short local_1e;
  uint32_t r;
  int16_t vr;
  int16_t vb;
  int16_t va;
  uint32_t b_local;
  uint32_t a_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = sextract32(a,0,8);
  uVar2 = extract32(b,0,8);
  local_1e = (short)iVar1 + (short)uVar2;
  if (local_1e < 0x100) {
    if (local_1e < 0) {
      (env->vfp).qc[0] = 1;
      local_1e = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0xff;
  }
  uVar2 = deposit32(0,0,8,(int)local_1e);
  iVar1 = sextract32(a,8,8);
  uVar3 = extract32(b,8,8);
  local_1e = (short)iVar1 + (short)uVar3;
  if (local_1e < 0x100) {
    if (local_1e < 0) {
      (env->vfp).qc[0] = 1;
      local_1e = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0xff;
  }
  uVar2 = deposit32(uVar2,8,8,(int)local_1e);
  iVar1 = sextract32(a,0x10,8);
  uVar3 = extract32(b,0x10,8);
  local_1e = (short)iVar1 + (short)uVar3;
  if (local_1e < 0x100) {
    if (local_1e < 0) {
      (env->vfp).qc[0] = 1;
      local_1e = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0xff;
  }
  uVar2 = deposit32(uVar2,0x10,8,(int)local_1e);
  iVar1 = sextract32(a,0x18,8);
  uVar3 = extract32(b,0x18,8);
  local_1e = (short)iVar1 + (short)uVar3;
  if (local_1e < 0x100) {
    if (local_1e < 0) {
      (env->vfp).qc[0] = 1;
      local_1e = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0xff;
  }
  uVar2 = deposit32(uVar2,0x18,8,(int)local_1e);
  return uVar2;
}

Assistant:

uint32_t HELPER(neon_uqadd_s8)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int16_t va, vb, vr;
    uint32_t r = 0;

    USATACC(8, 0);
    USATACC(8, 8);
    USATACC(8, 16);
    USATACC(8, 24);
    return r;
}